

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_io.c
# Opt level: O2

_Bool al_save_sample(char *filename,ALLEGRO_SAMPLE *spl)

{
  _Bool _Var1;
  char cVar2;
  char *ext;
  ACODEC_TABLE *pAVar3;
  
  ext = strrchr(filename,0x2e);
  if (ext == (char *)0x0) {
    cVar2 = _al_trace_prefix("audio",3,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/audio_io.c"
                             ,0x166,"al_save_sample");
    if (cVar2 != '\0') {
      _al_trace_suffix("Unable to determine extension for %s.\n",filename);
    }
  }
  else {
    pAVar3 = find_acodec_table_entry(ext);
    if ((pAVar3 != (ACODEC_TABLE *)0x0) &&
       (pAVar3->saver != (_func__Bool_char_ptr_ALLEGRO_SAMPLE_ptr *)0x0)) {
      _Var1 = (*pAVar3->saver)(filename,spl);
      return _Var1;
    }
    cVar2 = _al_trace_prefix("audio",3,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/audio_io.c"
                             ,0x16f,"al_save_sample");
    if (cVar2 != '\0') {
      _al_trace_suffix("No handler for audio file extension %s - therefore not trying to load %s.\n"
                       ,ext,filename);
    }
  }
  return false;
}

Assistant:

bool al_save_sample(const char *filename, ALLEGRO_SAMPLE *spl)
{
   const char *ext;
   ACODEC_TABLE *ent;

   ASSERT(filename);
   ext = strrchr(filename, '.');
   if (ext == NULL) {
      ALLEGRO_ERROR("Unable to determine extension for %s.\n", filename);
      return false;
   }

   ent = find_acodec_table_entry(ext);
   if (ent && ent->saver) {
      return (ent->saver)(filename, spl);
   }
   else {
      ALLEGRO_ERROR("No handler for audio file extension %s - "
         "therefore not trying to load %s.\n", ext, filename);
   }

   return false;
}